

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

void Abc_ZddPermTestInt(Abc_ZddMan *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int local_8c;
  int iPivot;
  int Union;
  int Set;
  int k;
  int i;
  int nTrans;
  int pComb [5];
  int local_58 [2];
  int pPerms [3] [5];
  int Size;
  int nPerms;
  Abc_ZddMan *p_local;
  
  pPerms[2][4] = 5;
  memcpy(local_58,&DAT_00ba88c0,0x3c);
  local_8c = 0;
  for (Set = 0; Set < 3; Set = Set + 1) {
    Abc_ZddPermPrint(pPerms[(long)Set + -1] + 3,pPerms[2][4]);
  }
  for (Set = 0; Set < 3; Set = Set + 1) {
    printf("Perm %d:\n",(ulong)(uint)Set);
    Abc_ZddPermPrint(pPerms[(long)Set + -1] + 3,pPerms[2][4]);
    iVar1 = Abc_ZddPerm2Comb(pPerms[(long)Set + -1] + 3,pPerms[2][4],&i);
    Abc_ZddCombPrint(&i,iVar1);
    for (Union = 0; Union < iVar1; Union = Union + 1) {
      iVar2 = Abc_ZddVarIJ(p,(&i)[Union] >> 0x10,(&i)[Union] & 0xffff);
      (&i)[Union] = iVar2;
    }
    Abc_ZddPermPrint(&i,iVar1);
    iVar1 = Abc_ZddBuildSet(p,&i,iVar1);
    local_8c = Abc_ZddUnion(p,local_8c,iVar1);
  }
  printf("\nResulting set of permutations:\n");
  Abc_ZddPrint(p,local_8c);
  uVar3 = Abc_ZddCountNodes(p,local_8c);
  uVar4 = Abc_ZddCountPaths(p,local_8c);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar3,(ulong)uVar4);
  iVar1 = Abc_ZddVarIJ(p,3,4);
  iVar1 = Abc_ZddPerm(p,local_8c,iVar1);
  printf("\nResulting set of permutations:\n");
  Abc_ZddPrint(p,iVar1);
  uVar3 = Abc_ZddCountNodes(p,iVar1);
  uVar4 = Abc_ZddCountPaths(p,iVar1);
  printf("Nodes = %d.   Path = %d.\n",(ulong)uVar3,(ulong)uVar4);
  printf("\n");
  return;
}

Assistant:

void Abc_ZddPermTestInt( Abc_ZddMan * p )
{
    int nPerms = 3;
    int Size = 5;
    int pPerms[3][5] = { {1, 0, 2, 4, 3}, {1, 2, 4, 0, 3}, {0, 3, 2, 1, 4} };
    int pComb[5], nTrans;
    int i, k, Set, Union = 0, iPivot;
    for ( i = 0; i < nPerms; i++ )
        Abc_ZddPermPrint( pPerms[i], Size );
    for ( i = 0; i < nPerms; i++ )
    {
        printf( "Perm %d:\n", i );
        Abc_ZddPermPrint( pPerms[i], Size );
        nTrans = Abc_ZddPerm2Comb( pPerms[i], Size, pComb );
        Abc_ZddCombPrint( pComb, nTrans );
        for ( k = 0; k < nTrans; k++ )
            pComb[k] = Abc_ZddVarIJ( p, pComb[k] >> 16, pComb[k] & 0xFFFF );
        Abc_ZddPermPrint( pComb, nTrans );
        // add to ZDD
        Set = Abc_ZddBuildSet( p, pComb, nTrans );
        Union = Abc_ZddUnion( p, Union, Set );
    }
    printf( "\nResulting set of permutations:\n" );
    Abc_ZddPrint( p, Union );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );

    iPivot = Abc_ZddVarIJ( p, 3, 4 );
    Union = Abc_ZddPerm( p, Union, iPivot );

    printf( "\nResulting set of permutations:\n" );
    Abc_ZddPrint( p, Union );
    printf( "Nodes = %d.   Path = %d.\n", Abc_ZddCountNodes(p, Union), Abc_ZddCountPaths(p, Union) );
    printf( "\n" );
}